

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_tcp_ref3(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *loop;
  uv_loop_t *unaff_RBX;
  uv_connect_t *puVar3;
  int64_t eval_b;
  int64_t eval_b_1;
  sockaddr_in addr;
  uv_tcp_t h;
  uv_buf_t uStack_648;
  sockaddr_in sStack_638;
  uv_udp_t uStack_628;
  uv_udp_send_t uStack_570;
  uv_loop_t *puStack_428;
  long lStack_418;
  long lStack_410;
  sockaddr_in sStack_408;
  uv_udp_t uStack_3f8;
  uv_loop_t *puStack_340;
  long lStack_330;
  long lStack_328;
  uv_udp_t uStack_320;
  uv_connect_t *puStack_268;
  undefined8 uStack_258;
  long lStack_250;
  uv_buf_t uStack_248;
  uv_loop_t *puStack_238;
  undefined1 auStack_220 [32];
  undefined1 auStack_200 [264];
  uv_loop_t *local_f8;
  sockaddr_in local_f0;
  uv__queue *local_e0;
  
  auStack_200._240_8_ = (uv__queue *)0x1b5b44;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_f0);
  local_e0 = (uv__queue *)(long)iVar1;
  auStack_200._256_8_ = (uv_loop_t *)0x0;
  if (local_e0 == (uv__queue *)0x0) {
    auStack_200._240_8_ = (uv__queue *)0x1b5b69;
    puVar2 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)&stack0xffffffffffffff20;
    auStack_200._240_8_ = (uv__queue *)0x1b5b79;
    uv_tcp_init(puVar2,(uv_tcp_t *)unaff_RBX);
    auStack_200._240_8_ = (uv__queue *)0x1b5b94;
    uv_tcp_connect(&connect_req,(uv_tcp_t *)unaff_RBX,(sockaddr *)&local_f0,connect_and_shutdown);
    auStack_200._240_8_ = (uv__queue *)0x1b5b9c;
    uv_unref((uv_handle_t *)unaff_RBX);
    auStack_200._240_8_ = (uv__queue *)0x1b5ba1;
    puVar2 = uv_default_loop();
    auStack_200._240_8_ = (uv__queue *)0x1b5bab;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_200._256_8_ = (uv_loop_t *)0x1;
    local_f8 = (uv_loop_t *)(long)connect_cb_called;
    if (local_f8 != (uv_loop_t *)0x1) goto LAB_001b5c6a;
    auStack_200._256_8_ = (uv_loop_t *)0x1;
    local_f8 = (uv_loop_t *)(long)shutdown_cb_called;
    if (local_f8 != (uv_loop_t *)0x1) goto LAB_001b5c79;
    auStack_200._240_8_ = (uv__queue *)0x1b5bff;
    do_close(&stack0xffffffffffffff20);
    auStack_200._240_8_ = (uv__queue *)0x1b5c04;
    unaff_RBX = uv_default_loop();
    auStack_200._240_8_ = (uv__queue *)0x1b5c18;
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    auStack_200._240_8_ = (uv__queue *)0x1b5c22;
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_200._256_8_ = (uv_loop_t *)0x0;
    auStack_200._240_8_ = (uv__queue *)0x1b5c30;
    puVar2 = uv_default_loop();
    auStack_200._240_8_ = (uv__queue *)0x1b5c38;
    iVar1 = uv_loop_close(puVar2);
    local_f8 = (uv_loop_t *)(long)iVar1;
    if ((uv_loop_t *)auStack_200._256_8_ == local_f8) {
      auStack_200._240_8_ = (uv__queue *)0x1b5c50;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_200._240_8_ = (uv__queue *)0x1b5c6a;
    run_test_tcp_ref3_cold_1();
LAB_001b5c6a:
    auStack_200._240_8_ = (uv__queue *)0x1b5c79;
    run_test_tcp_ref3_cold_2();
LAB_001b5c79:
    auStack_200._240_8_ = (uv__queue *)0x1b5c88;
    run_test_tcp_ref3_cold_3();
  }
  puVar3 = (uv_connect_t *)(auStack_200 + 0x100);
  iVar1 = (int)&local_f8;
  auStack_200._240_8_ = connect_and_shutdown;
  run_test_tcp_ref3_cold_4();
  if (puVar3 == &connect_req) {
    auStack_200._240_8_ = SEXT48(iVar1);
    auStack_200._232_8_ = (uv_close_cb)0x0;
    if ((uv__queue *)auStack_200._240_8_ == (uv__queue *)0x0) {
      auStack_200._216_8_ = (uv_loop_t *)0x1b5cde;
      iVar1 = uv_shutdown(&shutdown_req,connect_req.handle,shutdown_cb);
      connect_cb_called = connect_cb_called + 1;
      return iVar1;
    }
  }
  else {
    auStack_200._216_8_ = (uv_loop_t *)0x1b5cee;
    connect_and_shutdown_cold_1();
  }
  auStack_200._216_8_ = run_test_tcp_ref4;
  connect_and_shutdown_cold_2();
  auStack_200._216_8_ = unaff_RBX;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(auStack_220 + 0x10));
  auStack_200._0_8_ = SEXT48(iVar1);
  auStack_220._0_8_ = (uv_loop_t *)0x0;
  if ((void *)auStack_200._0_8_ == (void *)0x0) {
    puVar2 = uv_default_loop();
    unaff_RBX = (uv_loop_t *)auStack_200;
    uv_tcp_init(puVar2,(uv_tcp_t *)unaff_RBX);
    uv_tcp_connect(&connect_req,(uv_tcp_t *)unaff_RBX,(sockaddr *)(auStack_220 + 0x10),
                   connect_and_write);
    uv_unref((uv_handle_t *)unaff_RBX);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_220._0_8_ = (uv_loop_t *)0x1;
    auStack_220._8_8_ = SEXT48(connect_cb_called);
    if ((uv_loop_t *)auStack_220._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e66;
    auStack_220._0_8_ = (uv_loop_t *)0x1;
    auStack_220._8_8_ = SEXT48(write_cb_called);
    if ((uv_loop_t *)auStack_220._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e75;
    auStack_220._0_8_ = (uv_loop_t *)0x1;
    auStack_220._8_8_ = SEXT48(shutdown_cb_called);
    if ((uv_loop_t *)auStack_220._8_8_ != (uv_loop_t *)0x1) goto LAB_001b5e84;
    do_close(auStack_200);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,(void *)0x0);
    uv_run(unaff_RBX,UV_RUN_DEFAULT);
    auStack_220._0_8_ = (uv_loop_t *)0x0;
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    auStack_220._8_8_ = SEXT48(iVar1);
    if (auStack_220._0_8_ == auStack_220._8_8_) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_tcp_ref4_cold_1();
LAB_001b5e66:
    run_test_tcp_ref4_cold_2();
LAB_001b5e75:
    run_test_tcp_ref4_cold_3();
LAB_001b5e84:
    run_test_tcp_ref4_cold_4();
  }
  puVar3 = (uv_connect_t *)auStack_220;
  iVar1 = (int)auStack_220 + 8;
  run_test_tcp_ref4_cold_5();
  puStack_268 = (uv_connect_t *)0x1b5ebe;
  puStack_238 = unaff_RBX;
  uStack_248 = uv_buf_init(buffer,0x7fff);
  if (puVar3 == &connect_req) {
    lStack_250 = (long)iVar1;
    uStack_258 = 0;
    if (lStack_250 == 0) {
      puStack_268 = (uv_connect_t *)0x1b5f15;
      iVar1 = uv_write(&write_req,connect_req.handle,&uStack_248,1,write_cb);
      connect_cb_called = connect_cb_called + 1;
      return iVar1;
    }
  }
  else {
    puStack_268 = (uv_connect_t *)0x1b5f2a;
    connect_and_write_cold_1();
  }
  puStack_268 = (uv_connect_t *)run_test_udp_ref;
  connect_and_write_cold_2();
  puStack_340 = (uv_loop_t *)0x1b5f46;
  puStack_268 = puVar3;
  puVar2 = uv_default_loop();
  puStack_340 = (uv_loop_t *)0x1b5f56;
  uv_udp_init(puVar2,&uStack_320);
  puStack_340 = (uv_loop_t *)0x1b5f5e;
  uv_unref((uv_handle_t *)&uStack_320);
  puStack_340 = (uv_loop_t *)0x1b5f63;
  puVar2 = uv_default_loop();
  puStack_340 = (uv_loop_t *)0x1b5f6d;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_340 = (uv_loop_t *)0x1b5f75;
  do_close(&uStack_320);
  puStack_340 = (uv_loop_t *)0x1b5f7a;
  loop = uv_default_loop();
  puStack_340 = (uv_loop_t *)0x1b5f8e;
  uv_walk(loop,close_walk_cb,(void *)0x0);
  puStack_340 = (uv_loop_t *)0x1b5f98;
  uv_run(loop,UV_RUN_DEFAULT);
  lStack_328 = 0;
  puStack_340 = (uv_loop_t *)0x1b5fa6;
  puVar2 = uv_default_loop();
  puStack_340 = (uv_loop_t *)0x1b5fae;
  iVar1 = uv_loop_close(puVar2);
  lStack_330 = (long)iVar1;
  if (lStack_328 == lStack_330) {
    puStack_340 = (uv_loop_t *)0x1b5fc6;
    uv_library_shutdown();
    return 0;
  }
  puStack_340 = (uv_loop_t *)run_test_udp_ref2;
  run_test_udp_ref_cold_1();
  puStack_428 = (uv_loop_t *)0x1b5ffe;
  puStack_340 = loop;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_408);
  uStack_3f8.data = (void *)(long)iVar1;
  lStack_418 = 0;
  if (uStack_3f8.data == (void *)0x0) {
    puStack_428 = (uv_loop_t *)0x1b6023;
    puVar2 = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1b6033;
    uv_udp_init(puVar2,&uStack_3f8);
    puStack_428 = (uv_loop_t *)0x1b6042;
    uv_udp_bind(&uStack_3f8,(sockaddr *)&sStack_408,0);
    puStack_428 = (uv_loop_t *)0x1b6054;
    uv_udp_recv_start(&uStack_3f8,fail_cb,fail_cb);
    puStack_428 = (uv_loop_t *)0x1b605c;
    uv_unref((uv_handle_t *)&uStack_3f8);
    puStack_428 = (uv_loop_t *)0x1b6061;
    puVar2 = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1b606b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_428 = (uv_loop_t *)0x1b6073;
    do_close(&uStack_3f8);
    puStack_428 = (uv_loop_t *)0x1b6078;
    loop = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1b608c;
    uv_walk(loop,close_walk_cb,(void *)0x0);
    puStack_428 = (uv_loop_t *)0x1b6096;
    uv_run(loop,UV_RUN_DEFAULT);
    lStack_418 = 0;
    puStack_428 = (uv_loop_t *)0x1b60a4;
    puVar2 = uv_default_loop();
    puStack_428 = (uv_loop_t *)0x1b60ac;
    iVar1 = uv_loop_close(puVar2);
    lStack_410 = (long)iVar1;
    if (lStack_418 == lStack_410) {
      puStack_428 = (uv_loop_t *)0x1b60c4;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_428 = (uv_loop_t *)0x1b60de;
    run_test_udp_ref2_cold_1();
  }
  puStack_428 = (uv_loop_t *)run_test_udp_ref3;
  run_test_udp_ref2_cold_2();
  puStack_428 = loop;
  uStack_648 = uv_buf_init("PING",4);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_638);
  uStack_570.data = (void *)(long)iVar1;
  uStack_628.data = (void *)0x0;
  if (uStack_570.data == (void *)0x0) {
    puVar2 = uv_default_loop();
    uv_udp_init(puVar2,&uStack_628);
    uv_udp_send(&uStack_570,&uStack_628,&uStack_648,1,(sockaddr *)&sStack_638,req_cb);
    uv_unref((uv_handle_t *)&uStack_628);
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (req_cb_called == 1) {
      do_close(&uStack_628);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b6240;
    }
  }
  else {
    run_test_udp_ref3_cold_1();
  }
  run_test_udp_ref3_cold_2();
LAB_001b6240:
  run_test_udp_ref3_cold_3();
  req_cb_called = req_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_ref3) {
  struct sockaddr_in addr;
  uv_tcp_t h;
  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  uv_tcp_init(uv_default_loop(), &h);
  uv_tcp_connect(&connect_req,
                 &h,
                 (const struct sockaddr*) &addr,
                 connect_and_shutdown);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_EQ(1, connect_cb_called);
  ASSERT_EQ(1, shutdown_cb_called);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}